

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::GetHorzDirection(TEdge *HorzEdge,Direction *Dir,cInt *Left,cInt *Right)

{
  cInt *Right_local;
  cInt *Left_local;
  Direction *Dir_local;
  TEdge *HorzEdge_local;
  
  if ((HorzEdge->Bot).X < (HorzEdge->Top).X) {
    *Left = (HorzEdge->Bot).X;
    *Right = (HorzEdge->Top).X;
    *Dir = dLeftToRight;
  }
  else {
    *Left = (HorzEdge->Top).X;
    *Right = (HorzEdge->Bot).X;
    *Dir = dRightToLeft;
  }
  return;
}

Assistant:

void GetHorzDirection(TEdge& HorzEdge, Direction& Dir, cInt& Left, cInt& Right)
{
  if (HorzEdge.Bot.X < HorzEdge.Top.X)
  {
    Left = HorzEdge.Bot.X;
    Right = HorzEdge.Top.X;
    Dir = dLeftToRight;
  } else
  {
    Left = HorzEdge.Top.X;
    Right = HorzEdge.Bot.X;
    Dir = dRightToLeft;
  }
}